

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

BOOL swamp_cave_in(dw_map *map,uint8_t warp_index)

{
  uint8_t uVar1;
  bool local_1b;
  uint8_t swamp_south;
  uint8_t swamp_north;
  int warp_to;
  uint8_t warp_index_local;
  dw_map *map_local;
  
  uVar1 = map->warps_to[warp_index].map;
  local_1b = map->warps_from[5].map == uVar1 || map->warps_from[7].map == uVar1;
  return (BOOL)local_1b;
}

Assistant:

static BOOL swamp_cave_in(dw_map *map, uint8_t warp_index)
{
    int warp_to;
    uint8_t swamp_north, swamp_south;

    swamp_north = map->warps_from[WARP_SWAMP_NORTH].map;
    swamp_south = map->warps_from[WARP_SWAMP_SOUTH].map;
    warp_to = map->warps_to[warp_index].map;

    return (swamp_north == warp_to || swamp_south == warp_to);
}